

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

void __thiscall
wallet::LegacyScriptPubKeyMan::AddHDChain(LegacyScriptPubKeyMan *this,CHDChain *chain)

{
  CHDChain *chain_00;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int64_t iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  bool bVar7;
  int iVar8;
  undefined4 extraout_var;
  runtime_error *this_00;
  long in_FS_OFFSET;
  allocator<char> local_79;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long local_28;
  long *plVar9;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock30,
             &(this->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore,"cs_KeyStore",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0x3d8,false);
  iVar8 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[3])
                    ();
  plVar9 = (long *)CONCAT44(extraout_var,iVar8);
  (**(code **)(*plVar9 + 0x70))(&local_48,plVar9,1);
  local_48._M_string_length = (size_type)plVar9;
  bVar7 = WalletBatch::WriteHDChain((WalletBatch *)&local_48,chain);
  if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_48._M_dataplus._M_p + 0x28))();
  }
  if (bVar7) {
    bVar7 = base_blob<160U>::IsNull
                      ((base_blob<160U> *)&(this->super_LegacyDataSPKM).m_hd_chain.seed_id);
    chain_00 = &(this->super_LegacyDataSPKM).m_hd_chain;
    if (!bVar7) {
      LegacyDataSPKM::AddInactiveHDChain(&this->super_LegacyDataSPKM,chain_00);
    }
    (this->super_LegacyDataSPKM).m_hd_chain.nVersion = chain->nVersion;
    uVar5 = chain->nExternalChainCounter;
    uVar6 = chain->nInternalChainCounter;
    uVar1 = *(undefined8 *)(chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems;
    uVar2 = *(undefined8 *)
             ((chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems + 8);
    uVar3 = *(undefined8 *)
             ((chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems + 0x10);
    iVar4 = chain->m_next_internal_index;
    (this->super_LegacyDataSPKM).m_hd_chain.m_next_external_index = chain->m_next_external_index;
    (this->super_LegacyDataSPKM).m_hd_chain.m_next_internal_index = iVar4;
    *(undefined8 *)
     ((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.super_base_blob<160U>.m_data.
      _M_elems + 8) = uVar2;
    *(undefined8 *)
     ((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.super_base_blob<160U>.m_data.
      _M_elems + 0x10) = uVar3;
    chain_00->nExternalChainCounter = uVar5;
    chain_00->nInternalChainCounter = uVar6;
    *(undefined8 *)
     (this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.super_base_blob<160U>.m_data.
     _M_elems = uVar1;
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock30.super_unique_lock);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"AddHDChain",&local_79);
    std::operator+(&local_48,&local_68,": writing chain failed");
    std::runtime_error::runtime_error(this_00,(string *)&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

void LegacyScriptPubKeyMan::AddHDChain(const CHDChain& chain)
{
    LOCK(cs_KeyStore);
    // Store the new chain
    if (!WalletBatch(m_storage.GetDatabase()).WriteHDChain(chain)) {
        throw std::runtime_error(std::string(__func__) + ": writing chain failed");
    }
    // When there's an old chain, add it as an inactive chain as we are now rotating hd chains
    if (!m_hd_chain.seed_id.IsNull()) {
        AddInactiveHDChain(m_hd_chain);
    }

    m_hd_chain = chain;
}